

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ForStmt *stmt)

{
  pointer *this_00;
  shared_ptr<kratos::Var> *this_01;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  element_type *peVar4;
  bool *pbVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  ostream *poVar7;
  int64_t iVar8;
  remove_reference_t<long> *args;
  undefined4 extraout_var;
  element_type *peVar9;
  char (*format_str) [4];
  char (*format_str_00) [4];
  char (*format_str_01) [4];
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view __str;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  char *local_488;
  char *local_420;
  undefined1 local_340 [16];
  pointer local_330;
  string local_328;
  shared_ptr<kratos::Var> local_308;
  string local_2f8;
  element_type *local_2d8;
  string local_2d0;
  shared_ptr<kratos::Var> local_2b0;
  string local_2a0;
  element_type *local_280;
  string local_278;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  allocator<char> local_241;
  string local_240 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  undefined1 local_210 [8];
  string var_decl_str;
  string local_1e0;
  undefined1 local_1b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_decl;
  shared_ptr<kratos::IterVar> iter;
  ForStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
  *vargs_2;
  char *local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
  *vargs_1;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
  *vargs;
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  if ((this->generator_->debug & 1U) != 0) {
    uVar2 = Stream::line_no(&this->stream_);
    (stmt->super_Stmt).super_IRNode.verilog_ln = uVar2;
  }
  this_00 = &var_decl.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ForStmt::get_iter_var((ForStmt *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b0);
  peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  bVar1 = IterVar::is_gen_var(peVar4);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b0,
               (char (*) [7])"genvar");
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b0,
               (char (*) [4])0x45454b);
    peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&var_decl.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pbVar5 = Var::is_signed(&peVar4->super_Var);
    if ((*pbVar5 & 1U) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b0,
                 (char (*) [9])"unsigned");
    }
  }
  this_01 = (shared_ptr<kratos::Var> *)((long)&var_decl_str.field_2 + 8);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::IterVar,void>
            (this_01,(shared_ptr<kratos::IterVar> *)
                     &var_decl.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Stream::var_str_abi_cxx11_(&local_1e0,&this->stream_,this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b0,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)((long)&var_decl_str.field_2 + 8));
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b0);
  local_220._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240," ",&local_241);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)local_210,(string *)local_218,local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,in_R8);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  __str = indent(this);
  local_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_str;
  peVar9 = (element_type *)__str._M_len;
  local_258 = peVar9;
  pbVar6 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,__str);
  poVar7 = std::operator<<(pbVar6,"for (");
  poVar7 = std::operator<<(poVar7,(string *)local_210);
  std::operator<<(poVar7," = ");
  local_280 = (element_type *)ForStmt::start(stmt);
  local_88 = &local_278;
  local_90 = "{0}";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
           *)&local_280;
  local_b8.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<long,char[4],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
                   *)0x457783,(v7 *)vargs,format_str,(remove_reference_t<long> *)peVar9);
  local_a0 = &local_b8;
  local_c8 = fmt::v7::to_string_view<char,_0>(local_90);
  local_78 = &local_d8;
  local_80 = local_a0;
  local_20 = local_a0;
  local_10 = local_a0;
  local_18 = local_78;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_78,3,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_a0->string);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_d8.field_1.values_;
  format_str_02.size_ = local_d8.desc_;
  format_str_02.data_ = (char *)local_c8.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_278,(detail *)local_c8.data_,format_str_02,args_00);
  poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)&local_278);
  poVar7 = std::operator<<(poVar7,"; ");
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::IterVar,void>
            (&local_2b0,
             (shared_ptr<kratos::IterVar> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Stream::var_str_abi_cxx11_(&local_2a0,&this->stream_,&local_2b0);
  poVar7 = std::operator<<(poVar7,(string *)&local_2a0);
  iVar8 = ForStmt::end(stmt);
  args = (remove_reference_t<long> *)ForStmt::start(stmt);
  if ((long)args < iVar8) {
    local_420 = " < ";
  }
  else {
    local_420 = " > ";
  }
  std::operator<<(poVar7,local_420);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_2b0);
  std::__cxx11::string::~string((string *)&local_278);
  local_2d8 = (element_type *)ForStmt::end(stmt);
  local_e0 = &local_2d0;
  local_e8 = "{0}";
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
             *)&local_2d8;
  local_108.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<long,char[4],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
                   *)0x457783,(v7 *)vargs_1,format_str_00,args);
  local_f8 = &local_108;
  local_118 = fmt::v7::to_string_view<char,_0>(local_e8);
  local_68 = &local_128;
  local_70 = local_f8;
  local_38 = local_f8;
  local_28 = local_f8;
  local_30 = local_68;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_68,3,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_f8->string);
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_128.field_1.values_;
  format_str_03.size_ = local_128.desc_;
  format_str_03.data_ = (char *)local_118.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_2d0,(detail *)local_118.data_,format_str_03,args_01);
  poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)&local_2d0);
  poVar7 = std::operator<<(poVar7,"; ");
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::IterVar,void>
            (&local_308,
             (shared_ptr<kratos::IterVar> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Stream::var_str_abi_cxx11_(&local_2f8,&this->stream_,&local_308);
  poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
  iVar8 = ForStmt::step(stmt);
  if (iVar8 < 1) {
    local_488 = " -= ";
  }
  else {
    local_488 = " += ";
  }
  std::operator<<(poVar7,local_488);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_308);
  std::__cxx11::string::~string((string *)&local_2d0);
  iVar8 = ForStmt::step(stmt);
  iVar3 = std::abs((int)iVar8);
  local_330 = (pointer)CONCAT44(extraout_var,iVar3);
  local_130 = &local_328;
  local_138 = "{0}";
  vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
             *)&local_330;
  local_158.ulong_long_value =
       (unsigned_long_long)
       fmt::v7::make_args_checked<long,char[4],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
                   *)0x457783,(v7 *)vargs_2,format_str_01,local_128.desc_);
  local_148 = &local_158;
  local_168 = fmt::v7::to_string_view<char,_0>(local_138);
  local_58 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_60 = local_148;
  local_50 = local_148;
  local_40 = local_148;
  local_48 = local_58;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_58,3,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_148->string);
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_170.values_;
  format_str_04.size_ = (size_t)this_local;
  format_str_04.data_ = (char *)local_168.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_328,(detail *)local_168.data_,format_str_04,args_02);
  poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)&local_328);
  std::operator<<(poVar7,") ");
  std::__cxx11::string::~string((string *)&local_328);
  peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&var_decl.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = IterVar::is_gen_var(peVar4);
  if (!bVar1) {
    this->indent_ = this->indent_ + 1;
  }
  ForStmt::get_loop_body((ForStmt *)local_340);
  peVar9 = std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_340
                     );
  (**this->_vptr_SystemVerilogCodeGen)(this,peVar9);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)local_340);
  peVar4 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&var_decl.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = IterVar::is_gen_var(peVar4);
  if (!bVar1) {
    this->indent_ = this->indent_ - 1;
  }
  std::__cxx11::string::~string((string *)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b0);
  std::shared_ptr<kratos::IterVar>::~shared_ptr
            ((shared_ptr<kratos::IterVar> *)
             &var_decl.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ForStmt* stmt) {
    // for loop
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    auto iter = stmt->get_iter_var();

    // get var declaration
    std::vector<std::string> var_decl;
    if (iter->is_gen_var()) {
        // genvar don't have type declaration
        var_decl.emplace_back("genvar");
    } else {
        // maybe add support for much bigger number?
        var_decl.emplace_back("int");
        if (!iter->is_signed()) var_decl.emplace_back("unsigned");
    }

    var_decl.emplace_back(stream_.var_str(iter));
    auto var_decl_str = string::join(var_decl.begin(), var_decl.end(), " ");

    stream_ << indent() << "for (" << var_decl_str << " = ";
    stream_ << ::format("{0}", stmt->start()) << "; " << stream_.var_str(iter)
            << (stmt->end() > stmt->start() ? " < " : " > ");
    stream_ << ::format("{0}", stmt->end()) << "; " << stream_.var_str(iter)
            << (stmt->step() > 0 ? " += " : " -= ");
    stream_ << ::format("{0}", std::abs(stmt->step())) << ") ";
    if (!iter->is_gen_var()) indent_++;
    dispatch_node(stmt->get_loop_body().get());
    if (!iter->is_gen_var()) indent_--;
}